

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initCSSData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  QMultiHash<char,_QLatin1String> QStack_1d68;
  pair<char,_QLatin1String> local_1d58;
  undefined1 local_1d40;
  undefined8 local_1d38;
  char *local_1d30;
  undefined1 local_1d28;
  undefined8 local_1d20;
  char *local_1d18;
  undefined1 local_1d10;
  undefined8 local_1d08;
  char *local_1d00;
  undefined1 local_1cf8;
  undefined8 local_1cf0;
  char *local_1ce8;
  undefined1 local_1ce0;
  undefined8 local_1cd8;
  char *local_1cd0;
  undefined1 local_1cc8;
  undefined8 local_1cc0;
  char *local_1cb8;
  undefined1 local_1cb0;
  undefined8 local_1ca8;
  char *local_1ca0;
  undefined1 local_1c98;
  undefined8 local_1c90;
  char *local_1c88;
  undefined1 local_1c80;
  undefined8 local_1c78;
  char *local_1c70;
  undefined1 local_1c68;
  undefined8 local_1c60;
  char *local_1c58;
  undefined1 local_1c50;
  undefined8 local_1c48;
  char *local_1c40;
  undefined1 local_1c38;
  undefined8 local_1c30;
  char *local_1c28;
  undefined1 local_1c20;
  undefined8 local_1c18;
  char *local_1c10;
  undefined1 local_1c08;
  undefined8 local_1c00;
  char *local_1bf8;
  undefined1 local_1bf0;
  undefined8 local_1be8;
  char *local_1be0;
  undefined1 local_1bd8;
  undefined8 local_1bd0;
  char *local_1bc8;
  undefined1 local_1bc0;
  undefined8 local_1bb8;
  char *local_1bb0;
  undefined1 local_1ba8;
  undefined8 local_1ba0;
  char *local_1b98;
  undefined1 local_1b90;
  undefined8 local_1b88;
  char *local_1b80;
  undefined1 local_1b78;
  undefined8 local_1b70;
  char *local_1b68;
  undefined1 local_1b60;
  undefined8 local_1b58;
  char *local_1b50;
  undefined1 local_1b48;
  undefined8 local_1b40;
  char *local_1b38;
  undefined1 local_1b30;
  undefined8 local_1b28;
  char *local_1b20;
  undefined1 local_1b18;
  undefined8 local_1b10;
  char *local_1b08;
  undefined1 local_1b00;
  undefined8 local_1af8;
  char *local_1af0;
  undefined1 local_1ae8;
  undefined8 local_1ae0;
  char *local_1ad8;
  undefined1 local_1ad0;
  undefined8 local_1ac8;
  char *local_1ac0;
  undefined1 local_1ab8;
  undefined8 local_1ab0;
  char *local_1aa8;
  undefined1 local_1aa0;
  undefined8 local_1a98;
  char *local_1a90;
  undefined1 local_1a88;
  undefined8 local_1a80;
  char *local_1a78;
  undefined1 local_1a70;
  undefined8 local_1a68;
  char *local_1a60;
  undefined1 local_1a58;
  undefined8 local_1a50;
  char *local_1a48;
  undefined1 local_1a40;
  undefined8 local_1a38;
  char *local_1a30;
  undefined1 local_1a28;
  undefined8 local_1a20;
  char *local_1a18;
  undefined1 local_1a10;
  undefined8 local_1a08;
  char *local_1a00;
  undefined1 local_19f8;
  undefined8 local_19f0;
  char *local_19e8;
  undefined1 local_19e0;
  undefined8 local_19d8;
  char *local_19d0;
  undefined1 local_19c8;
  undefined8 local_19c0;
  char *local_19b8;
  undefined1 local_19b0;
  undefined8 local_19a8;
  char *local_19a0;
  undefined1 local_1998;
  undefined8 local_1990;
  char *local_1988;
  undefined1 local_1980;
  undefined8 local_1978;
  char *local_1970;
  undefined1 local_1968;
  undefined8 local_1960;
  char *local_1958;
  undefined1 local_1950;
  undefined8 local_1948;
  char *local_1940;
  undefined1 local_1938;
  undefined8 local_1930;
  char *local_1928;
  undefined1 local_1920;
  undefined8 local_1918;
  char *local_1910;
  undefined1 local_1908;
  undefined8 local_1900;
  char *local_18f8;
  undefined1 local_18f0;
  undefined8 local_18e8;
  char *local_18e0;
  undefined1 local_18d8;
  undefined8 local_18d0;
  char *local_18c8;
  undefined1 local_18c0;
  undefined8 local_18b8;
  char *local_18b0;
  undefined1 local_18a8;
  undefined8 local_18a0;
  char *local_1898;
  undefined1 local_1890;
  undefined8 local_1888;
  char *local_1880;
  undefined1 local_1878;
  undefined8 local_1870;
  char *local_1868;
  undefined1 local_1860;
  undefined8 local_1858;
  char *local_1850;
  undefined1 local_1848;
  undefined8 local_1840;
  char *local_1838;
  undefined1 local_1830;
  undefined8 local_1828;
  char *local_1820;
  undefined1 local_1818;
  undefined8 local_1810;
  char *local_1808;
  undefined1 local_1800;
  undefined8 local_17f8;
  char *local_17f0;
  undefined1 local_17e8;
  undefined8 local_17e0;
  char *local_17d8;
  undefined1 local_17d0;
  undefined8 local_17c8;
  char *local_17c0;
  undefined1 local_17b8;
  undefined8 local_17b0;
  char *local_17a8;
  undefined1 local_17a0;
  undefined8 local_1798;
  char *local_1790;
  undefined1 local_1788;
  undefined8 local_1780;
  char *local_1778;
  undefined1 local_1770;
  undefined8 local_1768;
  char *local_1760;
  undefined1 local_1758;
  undefined8 local_1750;
  char *local_1748;
  undefined1 local_1740;
  undefined8 local_1738;
  char *local_1730;
  undefined1 local_1728;
  undefined8 local_1720;
  char *local_1718;
  undefined1 local_1710;
  undefined8 local_1708;
  char *local_1700;
  undefined1 local_16f8;
  undefined8 local_16f0;
  char *local_16e8;
  undefined1 local_16e0;
  undefined8 local_16d8;
  char *local_16d0;
  undefined1 local_16c8;
  undefined8 local_16c0;
  char *local_16b8;
  undefined1 local_16b0;
  undefined8 local_16a8;
  char *local_16a0;
  undefined1 local_1698;
  undefined8 local_1690;
  char *local_1688;
  undefined1 local_1680;
  undefined8 local_1678;
  char *local_1670;
  undefined1 local_1668;
  undefined8 local_1660;
  char *local_1658;
  undefined1 local_1650;
  undefined8 local_1648;
  char *local_1640;
  undefined1 local_1638;
  undefined8 local_1630;
  char *local_1628;
  undefined1 local_1620;
  undefined8 local_1618;
  char *local_1610;
  undefined1 local_1608;
  undefined8 local_1600;
  char *local_15f8;
  undefined1 local_15f0;
  undefined8 local_15e8;
  char *local_15e0;
  undefined1 local_15d8;
  undefined8 local_15d0;
  char *local_15c8;
  undefined1 local_15c0;
  undefined8 local_15b8;
  char *local_15b0;
  undefined1 local_15a8;
  undefined8 local_15a0;
  char *local_1598;
  undefined1 local_1590;
  undefined8 local_1588;
  char *local_1580;
  undefined1 local_1578;
  undefined8 local_1570;
  char *local_1568;
  undefined1 local_1560;
  undefined8 local_1558;
  char *local_1550;
  undefined1 local_1548;
  undefined8 local_1540;
  char *local_1538;
  undefined1 local_1530;
  undefined8 local_1528;
  char *local_1520;
  undefined1 local_1518;
  undefined8 local_1510;
  char *local_1508;
  undefined1 local_1500;
  undefined8 local_14f8;
  char *local_14f0;
  undefined1 local_14e8;
  undefined8 local_14e0;
  char *local_14d8;
  undefined1 local_14d0;
  undefined8 local_14c8;
  char *local_14c0;
  undefined1 local_14b8;
  undefined8 local_14b0;
  char *local_14a8;
  undefined1 local_14a0;
  undefined8 local_1498;
  char *local_1490;
  undefined1 local_1488;
  undefined8 local_1480;
  char *local_1478;
  undefined1 local_1470;
  undefined8 local_1468;
  char *local_1460;
  undefined1 local_1458;
  undefined8 local_1450;
  char *local_1448;
  undefined1 local_1440;
  undefined8 local_1438;
  char *local_1430;
  undefined1 local_1428;
  undefined8 local_1420;
  char *local_1418;
  undefined1 local_1410;
  undefined8 local_1408;
  char *local_1400;
  undefined1 local_13f8;
  undefined8 local_13f0;
  char *local_13e8;
  undefined1 local_13e0;
  undefined8 local_13d8;
  char *local_13d0;
  undefined1 local_13c8;
  undefined8 local_13c0;
  char *local_13b8;
  undefined1 local_13b0;
  undefined8 local_13a8;
  char *local_13a0;
  undefined1 local_1398;
  undefined8 local_1390;
  char *local_1388;
  undefined1 local_1380;
  undefined8 local_1378;
  char *local_1370;
  undefined1 local_1368;
  undefined8 local_1360;
  char *local_1358;
  undefined1 local_1350;
  undefined8 local_1348;
  char *local_1340;
  undefined1 local_1338;
  undefined8 local_1330;
  char *local_1328;
  undefined1 local_1320;
  undefined8 local_1318;
  char *local_1310;
  undefined1 local_1308;
  undefined8 local_1300;
  char *local_12f8;
  undefined1 local_12f0;
  undefined8 local_12e8;
  char *local_12e0;
  undefined1 local_12d8;
  undefined8 local_12d0;
  char *local_12c8;
  undefined1 local_12c0;
  undefined8 local_12b8;
  char *local_12b0;
  undefined1 local_12a8;
  undefined8 local_12a0;
  char *local_1298;
  undefined1 local_1290;
  undefined8 local_1288;
  char *local_1280;
  undefined1 local_1278;
  undefined8 local_1270;
  char *local_1268;
  undefined1 local_1260;
  undefined8 local_1258;
  char *local_1250;
  undefined1 local_1248;
  undefined8 local_1240;
  char *local_1238;
  undefined1 local_1230;
  undefined8 local_1228;
  char *local_1220;
  undefined1 local_1218;
  undefined8 local_1210;
  char *local_1208;
  undefined1 local_1200;
  undefined8 local_11f8;
  char *local_11f0;
  undefined1 local_11e8;
  undefined8 local_11e0;
  char *local_11d8;
  undefined1 local_11d0;
  undefined8 local_11c8;
  char *local_11c0;
  undefined1 local_11b8;
  undefined8 local_11b0;
  char *local_11a8;
  undefined1 local_11a0;
  undefined8 local_1198;
  char *local_1190;
  undefined1 local_1188;
  undefined8 local_1180;
  char *local_1178;
  undefined1 local_1170;
  undefined8 local_1168;
  char *local_1160;
  undefined1 local_1158;
  undefined8 local_1150;
  char *local_1148;
  undefined1 local_1140;
  undefined8 local_1138;
  char *local_1130;
  undefined1 local_1128;
  undefined8 local_1120;
  char *local_1118;
  undefined1 local_1110;
  undefined8 local_1108;
  char *local_1100;
  undefined1 local_10f8;
  undefined8 local_10f0;
  char *local_10e8;
  undefined1 local_10e0;
  undefined8 local_10d8;
  char *local_10d0;
  undefined1 local_10c8;
  undefined8 local_10c0;
  char *local_10b8;
  undefined1 local_10b0;
  undefined8 local_10a8;
  char *local_10a0;
  undefined1 local_1098;
  undefined8 local_1090;
  char *local_1088;
  undefined1 local_1080;
  undefined8 local_1078;
  char *local_1070;
  undefined1 local_1068;
  undefined8 local_1060;
  char *local_1058;
  undefined1 local_1050;
  undefined8 local_1048;
  char *local_1040;
  undefined1 local_1038;
  undefined8 local_1030;
  char *local_1028;
  undefined1 local_1020;
  undefined8 local_1018;
  char *local_1010;
  undefined1 local_1008;
  undefined8 local_1000;
  char *local_ff8;
  undefined1 local_ff0;
  undefined8 local_fe8;
  char *local_fe0;
  undefined1 local_fd8;
  undefined8 local_fd0;
  char *local_fc8;
  undefined1 local_fc0;
  undefined8 local_fb8;
  char *local_fb0;
  undefined1 local_fa8;
  undefined8 local_fa0;
  char *local_f98;
  undefined1 local_f90;
  undefined8 local_f88;
  char *local_f80;
  undefined1 local_f78;
  undefined8 local_f70;
  char *local_f68;
  undefined1 local_f60;
  undefined8 local_f58;
  char *local_f50;
  undefined1 local_f48;
  undefined8 local_f40;
  char *local_f38;
  undefined1 local_f30;
  undefined8 local_f28;
  char *local_f20;
  undefined1 local_f18;
  undefined8 local_f10;
  char *local_f08;
  undefined1 local_f00;
  undefined8 local_ef8;
  char *local_ef0;
  undefined1 local_ee8;
  undefined8 local_ee0;
  char *local_ed8;
  undefined1 local_ed0;
  undefined8 local_ec8;
  char *local_ec0;
  undefined1 local_eb8;
  undefined8 local_eb0;
  char *local_ea8;
  undefined1 local_ea0;
  undefined8 local_e98;
  char *local_e90;
  undefined1 local_e88;
  undefined8 local_e80;
  char *local_e78;
  undefined1 local_e70;
  undefined8 local_e68;
  char *local_e60;
  undefined1 local_e58;
  undefined8 local_e50;
  char *local_e48;
  undefined1 local_e40;
  undefined8 local_e38;
  char *local_e30;
  undefined1 local_e28;
  undefined8 local_e20;
  char *local_e18;
  undefined1 local_e10;
  undefined8 local_e08;
  char *local_e00;
  undefined1 local_df8;
  undefined8 local_df0;
  char *local_de8;
  undefined1 local_de0;
  undefined8 local_dd8;
  char *local_dd0;
  undefined1 local_dc8;
  undefined8 local_dc0;
  char *local_db8;
  undefined1 local_db0;
  undefined8 local_da8;
  char *local_da0;
  undefined1 local_d98;
  undefined8 local_d90;
  char *local_d88;
  undefined1 local_d80;
  undefined8 local_d78;
  char *local_d70;
  undefined1 local_d68;
  undefined8 local_d60;
  char *local_d58;
  undefined1 local_d50;
  undefined8 local_d48;
  char *local_d40;
  undefined1 local_d38;
  undefined8 local_d30;
  char *local_d28;
  undefined1 local_d20;
  undefined8 local_d18;
  char *local_d10;
  undefined1 local_d08;
  undefined8 local_d00;
  char *local_cf8;
  undefined1 local_cf0;
  undefined8 local_ce8;
  char *local_ce0;
  undefined1 local_cd8;
  undefined8 local_cd0;
  char *local_cc8;
  undefined1 local_cc0;
  undefined8 local_cb8;
  char *local_cb0;
  undefined1 local_ca8;
  undefined8 local_ca0;
  char *local_c98;
  undefined1 local_c90;
  undefined8 local_c88;
  char *local_c80;
  undefined1 local_c78;
  undefined8 local_c70;
  char *local_c68;
  undefined1 local_c60;
  undefined8 local_c58;
  char *local_c50;
  undefined1 local_c48;
  undefined8 local_c40;
  char *local_c38;
  undefined1 local_c30;
  undefined8 local_c28;
  char *local_c20;
  undefined1 local_c18;
  undefined8 local_c10;
  char *local_c08;
  undefined1 local_c00;
  undefined8 local_bf8;
  char *local_bf0;
  undefined1 local_be8;
  undefined8 local_be0;
  char *local_bd8;
  undefined1 local_bd0;
  undefined8 local_bc8;
  char *local_bc0;
  undefined1 local_bb8;
  undefined8 local_bb0;
  char *local_ba8;
  undefined1 local_ba0;
  undefined8 local_b98;
  char *local_b90;
  undefined1 local_b88;
  undefined8 local_b80;
  char *local_b78;
  undefined1 local_b70;
  undefined8 local_b68;
  char *local_b60;
  undefined1 local_b58;
  undefined8 local_b50;
  char *local_b48;
  undefined1 local_b40;
  undefined8 local_b38;
  char *local_b30;
  undefined1 local_b28;
  undefined8 local_b20;
  char *local_b18;
  undefined1 local_b10;
  undefined8 local_b08;
  char *local_b00;
  undefined1 local_af8;
  undefined8 local_af0;
  char *local_ae8;
  undefined1 local_ae0;
  undefined8 local_ad8;
  char *local_ad0;
  undefined1 local_ac8;
  undefined8 local_ac0;
  char *local_ab8;
  undefined1 local_ab0;
  undefined8 local_aa8;
  char *local_aa0;
  undefined1 local_a98;
  undefined8 local_a90;
  char *local_a88;
  undefined1 local_a80;
  undefined8 local_a78;
  char *local_a70;
  undefined1 local_a68;
  undefined8 local_a60;
  char *local_a58;
  undefined1 local_a50;
  undefined8 local_a48;
  char *local_a40;
  undefined1 local_a38;
  undefined8 local_a30;
  char *local_a28;
  undefined1 local_a20;
  undefined8 local_a18;
  char *local_a10;
  undefined1 local_a08;
  undefined8 local_a00;
  char *local_9f8;
  undefined1 local_9f0;
  undefined8 local_9e8;
  char *local_9e0;
  undefined1 local_9d8;
  undefined8 local_9d0;
  char *local_9c8;
  undefined1 local_9c0;
  undefined8 local_9b8;
  char *local_9b0;
  undefined1 local_9a8;
  undefined8 local_9a0;
  char *local_998;
  undefined1 local_990;
  undefined8 local_988;
  char *local_980;
  undefined1 local_978;
  undefined8 local_970;
  char *local_968;
  undefined1 local_960;
  undefined8 local_958;
  char *local_950;
  undefined1 local_948;
  undefined8 local_940;
  char *local_938;
  undefined1 local_930;
  undefined8 local_928;
  char *local_920;
  undefined1 local_918;
  undefined8 local_910;
  char *local_908;
  undefined1 local_900;
  undefined8 local_8f8;
  char *local_8f0;
  undefined1 local_8e8;
  undefined8 local_8e0;
  char *local_8d8;
  undefined1 local_8d0;
  undefined8 local_8c8;
  char *local_8c0;
  undefined1 local_8b8;
  undefined8 local_8b0;
  char *local_8a8;
  undefined1 local_8a0;
  undefined8 local_898;
  char *local_890;
  undefined1 local_888;
  undefined8 local_880;
  char *local_878;
  undefined1 local_870;
  undefined8 local_868;
  char *local_860;
  undefined1 local_858;
  undefined8 local_850;
  char *local_848;
  undefined1 local_840;
  undefined8 local_838;
  char *local_830;
  undefined1 local_828;
  undefined8 local_820;
  char *local_818;
  undefined1 local_810;
  undefined8 local_808;
  char *local_800;
  undefined1 local_7f8;
  undefined8 local_7f0;
  char *local_7e8;
  undefined1 local_7e0;
  undefined8 local_7d8;
  char *local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  char *local_7b8;
  undefined1 local_7b0;
  undefined8 local_7a8;
  char *local_7a0;
  undefined1 local_798;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  char *local_758;
  undefined1 local_750;
  undefined8 local_748;
  char *local_740;
  undefined1 local_738;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  char *local_710;
  undefined1 local_708;
  undefined8 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined1 local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined1 local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined1 local_690;
  undefined8 local_688;
  char *local_680;
  undefined1 local_678;
  undefined8 local_670;
  char *local_668;
  undefined1 local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 local_648;
  undefined8 local_640;
  char *local_638;
  undefined1 local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_618;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined1 local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b8;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  char *local_578;
  undefined1 local_570;
  undefined8 local_568;
  char *local_560;
  undefined1 local_558;
  undefined8 local_550;
  char *local_548;
  undefined1 local_540;
  undefined8 local_538;
  char *local_530;
  undefined1 local_528;
  undefined8 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_1d58.first = 'i';
  local_1d58.second.m_size = 9;
  local_1d58.second.m_data = "important";
  local_1d40 = 0x70;
  local_1d38 = 2;
  local_1d30 = "px";
  local_1d28 = 0x65;
  local_1d20 = 2;
  local_1d18 = "em";
  list._M_len = 3;
  list._M_array = &local_1d58;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1d68,list);
  QMultiHash<char,_QLatin1String>::operator=(&css_keywords,&QStack_1d68);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1d68);
  local_1d58.first = 'a';
  local_1d58.second.m_size = 5;
  local_1d58.second.m_data = "align";
  local_1d40 = 99;
  local_1d38 = 7;
  local_1d30 = "content";
  local_1d28 = 0x69;
  local_1d20 = 5;
  local_1d18 = "items";
  local_1d10 = 0x73;
  local_1d08 = 4;
  local_1d00 = "self";
  local_1cf8 = 0x61;
  local_1cf0 = 3;
  local_1ce8 = "all";
  local_1ce0 = 0x61;
  local_1cd8 = 9;
  local_1cd0 = "animation";
  local_1cc8 = 100;
  local_1cc0 = 5;
  local_1cb8 = "delay";
  local_1cb0 = 100;
  local_1ca8 = 9;
  local_1ca0 = "direction";
  local_1c98 = 100;
  local_1c90 = 8;
  local_1c88 = "duration";
  local_1c80 = 0x66;
  local_1c78 = 4;
  local_1c70 = "fill";
  local_1c68 = 0x6d;
  local_1c60 = 4;
  local_1c58 = "mode";
  local_1c50 = 0x69;
  local_1c48 = 9;
  local_1c40 = "iteration";
  local_1c38 = 99;
  local_1c30 = 5;
  local_1c28 = "count";
  local_1c20 = 0x6e;
  local_1c18 = 4;
  local_1c10 = "name";
  local_1c08 = 0x70;
  local_1c00 = 4;
  local_1bf8 = "play";
  local_1bf0 = 0x73;
  local_1be8 = 5;
  local_1be0 = "state";
  local_1bd8 = 0x74;
  local_1bd0 = 6;
  local_1bc8 = "timing";
  local_1bc0 = 0x66;
  local_1bb8 = 8;
  local_1bb0 = "function";
  local_1ba8 = 0x61;
  local_1ba0 = 7;
  local_1b98 = "azimuth";
  local_1b90 = 0x62;
  local_1b88 = 8;
  local_1b80 = "backface";
  local_1b78 = 0x76;
  local_1b70 = 10;
  local_1b68 = "visibility";
  local_1b60 = 0x61;
  local_1b58 = 10;
  local_1b50 = "attachment";
  local_1b48 = 0x62;
  local_1b40 = 5;
  local_1b38 = "blend";
  local_1b30 = 0x6d;
  local_1b28 = 4;
  local_1b20 = "mode";
  local_1b18 = 99;
  local_1b10 = 4;
  local_1b08 = "clip";
  local_1b00 = 99;
  local_1af8 = 5;
  local_1af0 = "color";
  local_1ae8 = 0x69;
  local_1ae0 = 5;
  local_1ad8 = "image";
  local_1ad0 = 0x6f;
  local_1ac8 = 6;
  local_1ac0 = "origin";
  local_1ab8 = 0x70;
  local_1ab0 = 8;
  local_1aa8 = "position";
  local_1aa0 = 0x72;
  local_1a98 = 6;
  local_1a90 = "repeat";
  local_1a88 = 0x73;
  local_1a80 = 4;
  local_1a78 = "size";
  local_1a70 = 0x62;
  local_1a68 = 10;
  local_1a60 = "background";
  local_1a58 = 0x62;
  local_1a50 = 5;
  local_1a48 = "bleed";
  local_1a40 = 99;
  local_1a38 = 5;
  local_1a30 = "color";
  local_1a28 = 0x72;
  local_1a20 = 6;
  local_1a18 = "radius";
  local_1a10 = 0x72;
  local_1a08 = 6;
  local_1a00 = "radius";
  local_19f8 = 0x73;
  local_19f0 = 5;
  local_19e8 = "style";
  local_19e0 = 0x77;
  local_19d8 = 5;
  local_19d0 = "width";
  local_19c8 = 0x62;
  local_19c0 = 6;
  local_19b8 = "bottom";
  local_19b0 = 99;
  local_19a8 = 8;
  local_19a0 = "collapse";
  local_1998 = 99;
  local_1990 = 5;
  local_1988 = "color";
  local_1980 = 0x69;
  local_1978 = 5;
  local_1970 = "image";
  local_1968 = 0x6f;
  local_1960 = 6;
  local_1958 = "outset";
  local_1950 = 0x72;
  local_1948 = 6;
  local_1940 = "repeat";
  local_1938 = 0x73;
  local_1930 = 6;
  local_1928 = "source";
  local_1920 = 0x73;
  local_1918 = 5;
  local_1910 = "slice";
  local_1908 = 0x77;
  local_1900 = 5;
  local_18f8 = "width";
  local_18f0 = 99;
  local_18e8 = 5;
  local_18e0 = "color";
  local_18d8 = 0x73;
  local_18d0 = 5;
  local_18c8 = "style";
  local_18c0 = 0x77;
  local_18b8 = 5;
  local_18b0 = "width";
  local_18a8 = 0x6c;
  local_18a0 = 4;
  local_1898 = "left";
  local_1890 = 0x72;
  local_1888 = 6;
  local_1880 = "radius";
  local_1878 = 99;
  local_1870 = 5;
  local_1868 = "color";
  local_1860 = 0x73;
  local_1858 = 5;
  local_1850 = "style";
  local_1848 = 0x77;
  local_1840 = 5;
  local_1838 = "width";
  local_1830 = 0x72;
  local_1828 = 5;
  local_1820 = "right";
  local_1818 = 0x73;
  local_1810 = 7;
  local_1808 = "spacing";
  local_1800 = 0x73;
  local_17f8 = 5;
  local_17f0 = "style";
  local_17e8 = 99;
  local_17e0 = 5;
  local_17d8 = "color";
  local_17d0 = 0x6c;
  local_17c8 = 4;
  local_17c0 = "left";
  local_17b8 = 0x72;
  local_17b0 = 6;
  local_17a8 = "radius";
  local_17a0 = 0x72;
  local_1798 = 6;
  local_1790 = "radius";
  local_1788 = 0x73;
  local_1780 = 5;
  local_1778 = "style";
  local_1770 = 0x77;
  local_1768 = 5;
  local_1760 = "width";
  local_1758 = 0x74;
  local_1750 = 3;
  local_1748 = "top";
  local_1740 = 0x77;
  local_1738 = 5;
  local_1730 = "width";
  local_1728 = 0x62;
  local_1720 = 6;
  local_1718 = "border";
  local_1710 = 0x62;
  local_1708 = 6;
  local_1700 = "bottom";
  local_16f8 = 0x62;
  local_16f0 = 5;
  local_16e8 = "break";
  local_16e0 = 0x62;
  local_16d8 = 3;
  local_16d0 = "box";
  local_16c8 = 0x73;
  local_16c0 = 6;
  local_16b8 = "shadow";
  local_16b0 = 0x62;
  local_16a8 = 3;
  local_16a0 = "box";
  local_1698 = 0x73;
  local_1690 = 6;
  local_1688 = "sizing";
  local_1680 = 0x61;
  local_1678 = 5;
  local_1670 = "after";
  local_1668 = 0x62;
  local_1660 = 6;
  local_1658 = "before";
  local_1650 = 0x62;
  local_1648 = 5;
  local_1640 = "break";
  local_1638 = 0x69;
  local_1630 = 6;
  local_1628 = "inside";
  local_1620 = 99;
  local_1618 = 7;
  local_1610 = "caption";
  local_1608 = 0x73;
  local_1600 = 4;
  local_15f8 = "side";
  local_15f0 = 99;
  local_15e8 = 5;
  local_15e0 = "caret";
  local_15d8 = 99;
  local_15d0 = 5;
  local_15c8 = "color";
  local_15c0 = 99;
  local_15b8 = 5;
  local_15b0 = "clear";
  local_15a8 = 99;
  local_15a0 = 4;
  local_1598 = "clip";
  local_1590 = 99;
  local_1588 = 5;
  local_1580 = "color";
  local_1578 = 99;
  local_1570 = 7;
  local_1568 = "columns";
  local_1560 = 99;
  local_1558 = 6;
  local_1550 = "column";
  local_1548 = 99;
  local_1540 = 5;
  local_1538 = "count";
  local_1530 = 0x66;
  local_1528 = 4;
  local_1520 = "fill";
  local_1518 = 0x67;
  local_1510 = 3;
  local_1508 = "gap";
  local_1500 = 0x72;
  local_14f8 = 4;
  local_14f0 = "rule";
  local_14e8 = 99;
  local_14e0 = 5;
  local_14d8 = "color";
  local_14d0 = 0x73;
  local_14c8 = 5;
  local_14c0 = "style";
  local_14b8 = 0x77;
  local_14b0 = 5;
  local_14a8 = "width";
  local_14a0 = 0x73;
  local_1498 = 4;
  local_1490 = "span";
  local_1488 = 0x77;
  local_1480 = 5;
  local_1478 = "width";
  local_1470 = 99;
  local_1468 = 7;
  local_1460 = "content";
  local_1458 = 0x69;
  local_1450 = 9;
  local_1448 = "increment";
  local_1440 = 99;
  local_1438 = 7;
  local_1430 = "counter";
  local_1428 = 0x72;
  local_1420 = 5;
  local_1418 = "reset";
  local_1410 = 0x61;
  local_1408 = 5;
  local_1400 = "after";
  local_13f8 = 0x62;
  local_13f0 = 6;
  local_13e8 = "before";
  local_13e0 = 99;
  local_13d8 = 3;
  local_13d0 = "cue";
  local_13c8 = 99;
  local_13c0 = 6;
  local_13b8 = "cursor";
  local_13b0 = 100;
  local_13a8 = 9;
  local_13a0 = "direction";
  local_1398 = 100;
  local_1390 = 7;
  local_1388 = "display";
  local_1380 = 0x65;
  local_1378 = 9;
  local_1370 = "elevation";
  local_1368 = 0x65;
  local_1360 = 5;
  local_1358 = "empty";
  local_1350 = 99;
  local_1348 = 5;
  local_1340 = "cells";
  local_1338 = 0x66;
  local_1330 = 6;
  local_1328 = "filter";
  local_1320 = 0x66;
  local_1318 = 4;
  local_1310 = "flex";
  local_1308 = 0x62;
  local_1300 = 5;
  local_12f8 = "basis";
  local_12f0 = 100;
  local_12e8 = 9;
  local_12e0 = "direction";
  local_12d8 = 0x66;
  local_12d0 = 7;
  local_12c8 = "feature";
  local_12c0 = 0x73;
  local_12b8 = 8;
  local_12b0 = "settings";
  local_12a8 = 0x66;
  local_12a0 = 4;
  local_1298 = "flex";
  local_1290 = 0x66;
  local_1288 = 4;
  local_1280 = "flow";
  local_1278 = 0x67;
  local_1270 = 4;
  local_1268 = "grow";
  local_1260 = 0x73;
  local_1258 = 6;
  local_1250 = "shrink";
  local_1248 = 0x77;
  local_1240 = 4;
  local_1238 = "wrap";
  local_1230 = 0x66;
  local_1228 = 5;
  local_1220 = "float";
  local_1218 = 0x66;
  local_1210 = 6;
  local_1208 = "family";
  local_1200 = 0x6b;
  local_11f8 = 7;
  local_11f0 = "kerning";
  local_11e8 = 0x6c;
  local_11e0 = 8;
  local_11d8 = "language";
  local_11d0 = 0x6f;
  local_11c8 = 8;
  local_11c0 = "override";
  local_11b8 = 0x61;
  local_11b0 = 6;
  local_11a8 = "adjust";
  local_11a0 = 0x73;
  local_1198 = 4;
  local_1190 = "size";
  local_1188 = 0x73;
  local_1180 = 7;
  local_1178 = "stretch";
  local_1170 = 0x73;
  local_1168 = 5;
  local_1160 = "style";
  local_1158 = 0x73;
  local_1150 = 9;
  local_1148 = "synthesis";
  local_1140 = 0x76;
  local_1138 = 7;
  local_1130 = "variant";
  local_1128 = 0x61;
  local_1120 = 10;
  local_1118 = "alternates";
  local_1110 = 99;
  local_1108 = 4;
  local_1100 = "caps";
  local_10f8 = 0x65;
  local_10f0 = 4;
  local_10e8 = "east";
  local_10e0 = 0x61;
  local_10d8 = 5;
  local_10d0 = "asian";
  local_10c8 = 0x6c;
  local_10c0 = 9;
  local_10b8 = "ligatures";
  local_10b0 = 0x6e;
  local_10a8 = 7;
  local_10a0 = "numeric";
  local_1098 = 0x70;
  local_1090 = 8;
  local_1088 = "position";
  local_1080 = 0x77;
  local_1078 = 6;
  local_1070 = "weight";
  local_1068 = 0x66;
  local_1060 = 4;
  local_1058 = "font";
  local_1050 = 0x61;
  local_1048 = 4;
  local_1040 = "area";
  local_1038 = 0x61;
  local_1030 = 4;
  local_1028 = "auto";
  local_1020 = 99;
  local_1018 = 7;
  local_1010 = "columns";
  local_1008 = 0x66;
  local_1000 = 4;
  local_ff8 = "flow";
  local_ff0 = 0x72;
  local_fe8 = 4;
  local_fe0 = "rows";
  local_fd8 = 0x65;
  local_fd0 = 3;
  local_fc8 = "end";
  local_fc0 = 0x67;
  local_fb8 = 3;
  local_fb0 = "gap";
  local_fa8 = 0x73;
  local_fa0 = 5;
  local_f98 = "start";
  local_f90 = 99;
  local_f88 = 6;
  local_f80 = "column";
  local_f78 = 0x67;
  local_f70 = 3;
  local_f68 = "gap";
  local_f60 = 0x65;
  local_f58 = 3;
  local_f50 = "end";
  local_f48 = 0x67;
  local_f40 = 3;
  local_f38 = "gap";
  local_f30 = 0x73;
  local_f28 = 5;
  local_f20 = "start";
  local_f18 = 0x72;
  local_f10 = 3;
  local_f08 = "row";
  local_f00 = 0x61;
  local_ef8 = 5;
  local_ef0 = "areas";
  local_ee8 = 99;
  local_ee0 = 7;
  local_ed8 = "columns";
  local_ed0 = 0x72;
  local_ec8 = 4;
  local_ec0 = "rows";
  local_eb8 = 0x74;
  local_eb0 = 8;
  local_ea8 = "template";
  local_ea0 = 0x67;
  local_e98 = 4;
  local_e90 = "grid";
  local_e88 = 0x68;
  local_e80 = 7;
  local_e78 = "hanging";
  local_e70 = 0x70;
  local_e68 = 0xb;
  local_e60 = "punctuation";
  local_e58 = 0x68;
  local_e50 = 6;
  local_e48 = "height";
  local_e40 = 0x68;
  local_e38 = 7;
  local_e30 = "hyphens";
  local_e28 = 0x69;
  local_e20 = 9;
  local_e18 = "isolation";
  local_e10 = 0x6a;
  local_e08 = 7;
  local_e00 = "justify";
  local_df8 = 99;
  local_df0 = 7;
  local_de8 = "content";
  local_de0 = 0x69;
  local_dd8 = 5;
  local_dd0 = "items";
  local_dc8 = 0x73;
  local_dc0 = 4;
  local_db8 = "self";
  local_db0 = 0x6c;
  local_da8 = 9;
  local_da0 = "leftimage";
  local_d98 = 0x6c;
  local_d90 = 6;
  local_d88 = "letter";
  local_d80 = 0x73;
  local_d78 = 7;
  local_d70 = "spacing";
  local_d68 = 0x62;
  local_d60 = 5;
  local_d58 = "break";
  local_d50 = 0x6c;
  local_d48 = 4;
  local_d40 = "line";
  local_d38 = 0x73;
  local_d30 = 5;
  local_d28 = "style";
  local_d20 = 0x69;
  local_d18 = 5;
  local_d10 = "image";
  local_d08 = 0x73;
  local_d00 = 5;
  local_cf8 = "style";
  local_cf0 = 0x70;
  local_ce8 = 8;
  local_ce0 = "position";
  local_cd8 = 0x74;
  local_cd0 = 4;
  local_cc8 = "type";
  local_cc0 = 0x6c;
  local_cb8 = 4;
  local_cb0 = "list";
  local_ca8 = 0x73;
  local_ca0 = 5;
  local_c98 = "style";
  local_c90 = 0x62;
  local_c88 = 6;
  local_c80 = "bottom";
  local_c78 = 0x6c;
  local_c70 = 4;
  local_c68 = "left";
  local_c60 = 0x72;
  local_c58 = 5;
  local_c50 = "right";
  local_c48 = 0x74;
  local_c40 = 3;
  local_c38 = "top";
  local_c30 = 0x6d;
  local_c28 = 6;
  local_c20 = "margin";
  local_c18 = 0x6d;
  local_c10 = 6;
  local_c08 = "marker";
  local_c00 = 0x6f;
  local_bf8 = 6;
  local_bf0 = "offset";
  local_be8 = 0x6d;
  local_be0 = 5;
  local_bd8 = "marks";
  local_bd0 = 0x6d;
  local_bc8 = 3;
  local_bc0 = "max";
  local_bb8 = 0x68;
  local_bb0 = 6;
  local_ba8 = "height";
  local_ba0 = 0x77;
  local_b98 = 5;
  local_b90 = "width";
  local_b88 = 0x6d;
  local_b80 = 3;
  local_b78 = "min";
  local_b70 = 0x6d;
  local_b68 = 3;
  local_b60 = "mix";
  local_b58 = 0x62;
  local_b50 = 5;
  local_b48 = "blend";
  local_b40 = 0x6d;
  local_b38 = 4;
  local_b30 = "mode";
  local_b28 = 0x6e;
  local_b20 = 3;
  local_b18 = "nav";
  local_b10 = 0x75;
  local_b08 = 2;
  local_b00 = "up";
  local_af8 = 100;
  local_af0 = 4;
  local_ae8 = "down";
  local_ae0 = 0x6c;
  local_ad8 = 4;
  local_ad0 = "left";
  local_ac8 = 0x72;
  local_ac0 = 5;
  local_ab8 = "right";
  local_ab0 = 0x6f;
  local_aa8 = 7;
  local_aa0 = "opacity";
  local_a98 = 0x6f;
  local_a90 = 5;
  local_a88 = "order";
  local_a80 = 0x6f;
  local_a78 = 7;
  local_a70 = "orphans";
  local_a68 = 99;
  local_a60 = 5;
  local_a58 = "color";
  local_a50 = 0x6f;
  local_a48 = 6;
  local_a40 = "offset";
  local_a38 = 0x73;
  local_a30 = 5;
  local_a28 = "style";
  local_a20 = 0x77;
  local_a18 = 5;
  local_a10 = "width";
  local_a08 = 0x6f;
  local_a00 = 7;
  local_9f8 = "outline";
  local_9f0 = 0x77;
  local_9e8 = 4;
  local_9e0 = "wrap";
  local_9d8 = 0x6f;
  local_9d0 = 8;
  local_9c8 = "overflow";
  local_9c0 = 0x62;
  local_9b8 = 6;
  local_9b0 = "bottom";
  local_9a8 = 0x6c;
  local_9a0 = 4;
  local_998 = "left";
  local_990 = 0x72;
  local_988 = 5;
  local_980 = "right";
  local_978 = 0x74;
  local_970 = 3;
  local_968 = "top";
  local_960 = 0x70;
  local_958 = 7;
  local_950 = "padding";
  local_948 = 0x62;
  local_940 = 5;
  local_938 = "break";
  local_930 = 0x61;
  local_928 = 5;
  local_920 = "after";
  local_918 = 0x62;
  local_910 = 6;
  local_908 = "before";
  local_900 = 0x69;
  local_8f8 = 6;
  local_8f0 = "inside";
  local_8e8 = 0x70;
  local_8e0 = 4;
  local_8d8 = "page";
  local_8d0 = 0x61;
  local_8c8 = 5;
  local_8c0 = "after";
  local_8b8 = 0x62;
  local_8b0 = 6;
  local_8a8 = "before";
  local_8a0 = 0x70;
  local_898 = 5;
  local_890 = "pause";
  local_888 = 0x70;
  local_880 = 0xb;
  local_878 = "perspective";
  local_870 = 0x6f;
  local_868 = 6;
  local_860 = "origin";
  local_858 = 0x72;
  local_850 = 5;
  local_848 = "range";
  local_840 = 0x70;
  local_838 = 5;
  local_830 = "pitch";
  local_828 = 99;
  local_820 = 7;
  local_818 = "content";
  local_810 = 0x69;
  local_808 = 5;
  local_800 = "items";
  local_7f8 = 0x70;
  local_7f0 = 5;
  local_7e8 = "place";
  local_7e0 = 0x73;
  local_7d8 = 4;
  local_7d0 = "self";
  local_7c8 = 0x70;
  local_7c0 = 4;
  local_7b8 = "play";
  local_7b0 = 100;
  local_7a8 = 6;
  local_7a0 = "during";
  local_798 = 0x70;
  local_790 = 8;
  local_788 = "position";
  local_780 = 0x71;
  local_778 = 6;
  local_770 = "quotes";
  local_768 = 0x72;
  local_760 = 6;
  local_758 = "resize";
  local_750 = 0x72;
  local_748 = 4;
  local_740 = "rest";
  local_738 = 0x61;
  local_730 = 5;
  local_728 = "after";
  local_720 = 0x62;
  local_718 = 6;
  local_710 = "before";
  local_708 = 0x72;
  local_700 = 4;
  local_6f8 = "rest";
  local_6f0 = 0x72;
  local_6e8 = 8;
  local_6e0 = "richness";
  local_6d8 = 0x72;
  local_6d0 = 5;
  local_6c8 = "right";
  local_6c0 = 0x73;
  local_6b8 = 4;
  local_6b0 = "size";
  local_6a8 = 0x68;
  local_6a0 = 6;
  local_698 = "header";
  local_690 = 0x6e;
  local_688 = 7;
  local_680 = "numeral";
  local_678 = 0x73;
  local_670 = 5;
  local_668 = "speak";
  local_660 = 0x70;
  local_658 = 0xb;
  local_650 = "punctuation";
  local_648 = 0x73;
  local_640 = 5;
  local_638 = "speak";
  local_630 = 0x73;
  local_628 = 6;
  local_620 = "speech";
  local_618 = 0x72;
  local_610 = 4;
  local_608 = "rate";
  local_600 = 0x73;
  local_5f8 = 6;
  local_5f0 = "stress";
  local_5e8 = 0x74;
  local_5e0 = 3;
  local_5d8 = "tab";
  local_5d0 = 0x73;
  local_5c8 = 4;
  local_5c0 = "size";
  local_5b8 = 0x74;
  local_5b0 = 5;
  local_5a8 = "table";
  local_5a0 = 0x6c;
  local_598 = 6;
  local_590 = "layout";
  local_588 = 0x74;
  local_580 = 4;
  local_578 = "text";
  local_570 = 0x61;
  local_568 = 5;
  local_560 = "align";
  local_558 = 0x6c;
  local_550 = 4;
  local_548 = "last";
  local_540 = 100;
  local_538 = 10;
  local_530 = "decoration";
  local_528 = 99;
  local_520 = 5;
  local_518 = "color";
  local_510 = 0x6c;
  local_508 = 4;
  local_500 = "line";
  local_4f8 = 0x73;
  local_4f0 = 4;
  local_4e8 = "skip";
  local_4e0 = 0x73;
  local_4d8 = 5;
  local_4d0 = "style";
  local_4c8 = 0x69;
  local_4c0 = 6;
  local_4b8 = "indent";
  local_4b0 = 0x6f;
  local_4a8 = 8;
  local_4a0 = "overflow";
  local_498 = 0x73;
  local_490 = 6;
  local_488 = "shadow";
  local_480 = 0x74;
  local_478 = 9;
  local_470 = "transform";
  local_468 = 0x75;
  local_460 = 9;
  local_458 = "underline";
  local_450 = 0x70;
  local_448 = 8;
  local_440 = "position";
  local_438 = 0x74;
  local_430 = 3;
  local_428 = "top";
  local_420 = 0x74;
  local_418 = 9;
  local_410 = "transform";
  local_408 = 0x6f;
  local_400 = 6;
  local_3f8 = "origin";
  local_3f0 = 0x73;
  local_3e8 = 5;
  local_3e0 = "style";
  local_3d8 = 0x74;
  local_3d0 = 10;
  local_3c8 = "transition";
  local_3c0 = 100;
  local_3b8 = 5;
  local_3b0 = "delay";
  local_3a8 = 100;
  local_3a0 = 8;
  local_398 = "duration";
  local_390 = 0x70;
  local_388 = 8;
  local_380 = "property";
  local_378 = 0x74;
  local_370 = 6;
  local_368 = "timing";
  local_360 = 0x66;
  local_358 = 8;
  local_350 = "function";
  local_348 = 0x75;
  local_340 = 7;
  local_338 = "unicode";
  local_330 = 0x62;
  local_328 = 4;
  local_320 = "bidi";
  local_318 = 0x76;
  local_310 = 8;
  local_308 = "vertical";
  local_300 = 0x61;
  local_2f8 = 5;
  local_2f0 = "align";
  local_2e8 = 0x76;
  local_2e0 = 10;
  local_2d8 = "visibility";
  local_2d0 = 0x62;
  local_2c8 = 7;
  local_2c0 = "balance";
  local_2b8 = 100;
  local_2b0 = 8;
  local_2a8 = "duration";
  local_2a0 = 0x66;
  local_298 = 6;
  local_290 = "family";
  local_288 = 0x70;
  local_280 = 5;
  local_278 = "pitch";
  local_270 = 0x72;
  local_268 = 5;
  local_260 = "range";
  local_258 = 0x72;
  local_250 = 4;
  local_248 = "rate";
  local_240 = 0x73;
  local_238 = 6;
  local_230 = "stress";
  local_228 = 0x76;
  local_220 = 6;
  local_218 = "volume";
  local_210 = 0x76;
  local_208 = 5;
  local_200 = "voice";
  local_1f8 = 0x76;
  local_1f0 = 6;
  local_1e8 = "volume";
  local_1e0 = 0x77;
  local_1d8 = 5;
  local_1d0 = "white";
  local_1c8 = 0x73;
  local_1c0 = 5;
  local_1b8 = "space";
  local_1b0 = 0x77;
  local_1a8 = 6;
  local_1a0 = "widows";
  local_198 = 0x77;
  local_190 = 5;
  local_188 = "width";
  local_180 = 0x77;
  local_178 = 4;
  local_170 = "will";
  local_168 = 99;
  local_160 = 6;
  local_158 = "change";
  local_150 = 0x77;
  local_148 = 4;
  local_140 = "word";
  local_138 = 0x62;
  local_130 = 5;
  local_128 = "break";
  local_120 = 0x73;
  local_118 = 7;
  local_110 = "spacing";
  local_108 = 0x77;
  local_100 = 4;
  local_f8 = "wrap";
  local_f0 = 0x78;
  local_e8 = 1;
  local_e0 = "x";
  local_d8 = 0x79;
  local_d0 = 1;
  local_c8 = "y";
  local_c0 = 0x7a;
  local_b8 = 1;
  local_b0 = "z";
  local_a8 = 0x69;
  local_a0 = 5;
  local_98 = "index";
  local_90 = 0x72;
  local_88 = 3;
  local_80 = "rgb";
  local_78 = 0x73;
  local_70 = 4;
  local_68 = "sans";
  local_60 = 0x73;
  local_58 = 5;
  local_50 = "serif";
  local_48 = 0x6e;
  local_40 = 6;
  local_38 = "normal";
  list_00._M_len = 0x137;
  list_00._M_array = &local_1d58;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1d68,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&css_types,&QStack_1d68);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1d68);
  local_1d58.first = '\0';
  local_1d58._1_7_ = 0;
  local_1d58.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&css_literals,(QMultiHash<char,_QLatin1String> *)&local_1d58);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d58);
  local_1d58.first = '\0';
  local_1d58._1_7_ = 0;
  local_1d58.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&css_builtin,(QMultiHash<char,_QLatin1String> *)&local_1d58);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d58);
  local_1d58.first = '\0';
  local_1d58._1_7_ = 0;
  local_1d58.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&css_other,(QMultiHash<char,_QLatin1String> *)&local_1d58);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d58);
  return;
}

Assistant:

void initCSSData() {
    css_keywords = {{'i', QLatin1String("important")},
                    {'p', QLatin1String("px")},
                    {'e', QLatin1String("em")}};

    css_types = {{'a', QLatin1String("align")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("items")},
                 {'s', QLatin1String("self")},
                 {'a', QLatin1String("all")},
                 {'a', QLatin1String("animation")},
                 {'d', QLatin1String("delay")},
                 {'d', QLatin1String("direction")},
                 {'d', QLatin1String("duration")},
                 {'f', QLatin1String("fill")},
                 {'m', QLatin1String("mode")},
                 {'i', QLatin1String("iteration")},
                 {'c', QLatin1String("count")},
                 {'n', QLatin1String("name")},
                 {'p', QLatin1String("play")},
                 {'s', QLatin1String("state")},
                 {'t', QLatin1String("timing")},
                 {'f', QLatin1String("function")},
                 {'a', QLatin1String("azimuth")},
                 {'b', QLatin1String("backface")},
                 {'v', QLatin1String("visibility")},
                 {'a', QLatin1String("attachment")},
                 {'b', QLatin1String("blend")},
                 {'m', QLatin1String("mode")},
                 {'c', QLatin1String("clip")},
                 {'c', QLatin1String("color")},
                 {'i', QLatin1String("image")},
                 {'o', QLatin1String("origin")},
                 {'p', QLatin1String("position")},
                 {'r', QLatin1String("repeat")},
                 {'s', QLatin1String("size")},
                 {'b', QLatin1String("background")},
                 {'b', QLatin1String("bleed")},
                 {'c', QLatin1String("color")},
                 {'r', QLatin1String("radius")},
                 {'r', QLatin1String("radius")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'b', QLatin1String("bottom")},
                 {'c', QLatin1String("collapse")},
                 {'c', QLatin1String("color")},
                 {'i', QLatin1String("image")},
                 {'o', QLatin1String("outset")},
                 {'r', QLatin1String("repeat")},
                 {'s', QLatin1String("source")},
                 {'s', QLatin1String("slice")},
                 {'w', QLatin1String("width")},
                 {'c', QLatin1String("color")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("radius")},
                 {'c', QLatin1String("color")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'r', QLatin1String("right")},
                 {'s', QLatin1String("spacing")},
                 {'s', QLatin1String("style")},
                 {'c', QLatin1String("color")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("radius")},
                 {'r', QLatin1String("radius")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'t', QLatin1String("top")},
                 {'w', QLatin1String("width")},
                 {'b', QLatin1String("border")},
                 {'b', QLatin1String("bottom")},
                 {'b', QLatin1String("break")},
                 {'b', QLatin1String("box")},
                 {'s', QLatin1String("shadow")},
                 {'b', QLatin1String("box")},
                 {'s', QLatin1String("sizing")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'b', QLatin1String("break")},
                 {'i', QLatin1String("inside")},
                 {'c', QLatin1String("caption")},
                 {'s', QLatin1String("side")},
                 {'c', QLatin1String("caret")},
                 {'c', QLatin1String("color")},
                 {'c', QLatin1String("clear")},
                 {'c', QLatin1String("clip")},
                 {'c', QLatin1String("color")},
                 {'c', QLatin1String("columns")},
                 {'c', QLatin1String("column")},
                 {'c', QLatin1String("count")},
                 {'f', QLatin1String("fill")},
                 {'g', QLatin1String("gap")},
                 {'r', QLatin1String("rule")},
                 {'c', QLatin1String("color")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'s', QLatin1String("span")},
                 {'w', QLatin1String("width")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("increment")},
                 {'c', QLatin1String("counter")},
                 {'r', QLatin1String("reset")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'c', QLatin1String("cue")},
                 {'c', QLatin1String("cursor")},
                 {'d', QLatin1String("direction")},
                 {'d', QLatin1String("display")},
                 {'e', QLatin1String("elevation")},
                 {'e', QLatin1String("empty")},
                 {'c', QLatin1String("cells")},
                 {'f', QLatin1String("filter")},
                 {'f', QLatin1String("flex")},
                 {'b', QLatin1String("basis")},
                 {'d', QLatin1String("direction")},
                 {'f', QLatin1String("feature")},
                 {'s', QLatin1String("settings")},
                 {'f', QLatin1String("flex")},
                 {'f', QLatin1String("flow")},
                 {'g', QLatin1String("grow")},
                 {'s', QLatin1String("shrink")},
                 {'w', QLatin1String("wrap")},
                 {'f', QLatin1String("float")},
                 {'f', QLatin1String("family")},
                 {'k', QLatin1String("kerning")},
                 {'l', QLatin1String("language")},
                 {'o', QLatin1String("override")},
                 {'a', QLatin1String("adjust")},
                 {'s', QLatin1String("size")},
                 {'s', QLatin1String("stretch")},
                 {'s', QLatin1String("style")},
                 {'s', QLatin1String("synthesis")},
                 {'v', QLatin1String("variant")},
                 {'a', QLatin1String("alternates")},
                 {'c', QLatin1String("caps")},
                 {'e', QLatin1String("east")},
                 {'a', QLatin1String("asian")},
                 {'l', QLatin1String("ligatures")},
                 {'n', QLatin1String("numeric")},
                 {'p', QLatin1String("position")},
                 {'w', QLatin1String("weight")},
                 {'f', QLatin1String("font")},
                 {'a', QLatin1String("area")},
                 {'a', QLatin1String("auto")},
                 {'c', QLatin1String("columns")},
                 {'f', QLatin1String("flow")},
                 {'r', QLatin1String("rows")},
                 {'e', QLatin1String("end")},
                 {'g', QLatin1String("gap")},
                 {'s', QLatin1String("start")},
                 {'c', QLatin1String("column")},
                 {'g', QLatin1String("gap")},
                 {'e', QLatin1String("end")},
                 {'g', QLatin1String("gap")},
                 {'s', QLatin1String("start")},
                 {'r', QLatin1String("row")},
                 {'a', QLatin1String("areas")},
                 {'c', QLatin1String("columns")},
                 {'r', QLatin1String("rows")},
                 {'t', QLatin1String("template")},
                 {'g', QLatin1String("grid")},
                 {'h', QLatin1String("hanging")},
                 {'p', QLatin1String("punctuation")},
                 {'h', QLatin1String("height")},
                 {'h', QLatin1String("hyphens")},
                 {'i', QLatin1String("isolation")},
                 {'j', QLatin1String("justify")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("items")},
                 {'s', QLatin1String("self")},
                 {'l', QLatin1String("leftimage")},
                 {'l', QLatin1String("letter")},
                 {'s', QLatin1String("spacing")},
                 {'b', QLatin1String("break")},
                 {'l', QLatin1String("line")},
                 {'s', QLatin1String("style")},
                 {'i', QLatin1String("image")},
                 {'s', QLatin1String("style")},
                 {'p', QLatin1String("position")},
                 {'t', QLatin1String("type")},
                 {'l', QLatin1String("list")},
                 {'s', QLatin1String("style")},
                 {'b', QLatin1String("bottom")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("right")},
                 {'t', QLatin1String("top")},
                 {'m', QLatin1String("margin")},
                 {'m', QLatin1String("marker")},
                 {'o', QLatin1String("offset")},
                 {'m', QLatin1String("marks")},
                 {'m', QLatin1String("max")},
                 {'h', QLatin1String("height")},
                 {'w', QLatin1String("width")},
                 {'m', QLatin1String("min")},
                 {'m', QLatin1String("mix")},
                 {'b', QLatin1String("blend")},
                 {'m', QLatin1String("mode")},
                 {'n', QLatin1String("nav")},
                 {'u', QLatin1String("up")},
                 {'d', QLatin1String("down")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("right")},
                 {'o', QLatin1String("opacity")},
                 {'o', QLatin1String("order")},
                 {'o', QLatin1String("orphans")},
                 {'c', QLatin1String("color")},
                 {'o', QLatin1String("offset")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'o', QLatin1String("outline")},
                 {'w', QLatin1String("wrap")},
                 {'o', QLatin1String("overflow")},
                 {'b', QLatin1String("bottom")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("right")},
                 {'t', QLatin1String("top")},
                 {'p', QLatin1String("padding")},
                 {'b', QLatin1String("break")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'i', QLatin1String("inside")},
                 {'p', QLatin1String("page")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'p', QLatin1String("pause")},
                 {'p', QLatin1String("perspective")},
                 {'o', QLatin1String("origin")},
                 {'r', QLatin1String("range")},
                 {'p', QLatin1String("pitch")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("items")},
                 {'p', QLatin1String("place")},
                 {'s', QLatin1String("self")},
                 {'p', QLatin1String("play")},
                 {'d', QLatin1String("during")},
                 {'p', QLatin1String("position")},
                 {'q', QLatin1String("quotes")},
                 {'r', QLatin1String("resize")},
                 {'r', QLatin1String("rest")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'r', QLatin1String("rest")},
                 {'r', QLatin1String("richness")},
                 {'r', QLatin1String("right")},
                 {'s', QLatin1String("size")},
                 {'h', QLatin1String("header")},
                 {'n', QLatin1String("numeral")},
                 {'s', QLatin1String("speak")},
                 {'p', QLatin1String("punctuation")},
                 {'s', QLatin1String("speak")},
                 {'s', QLatin1String("speech")},
                 {'r', QLatin1String("rate")},
                 {'s', QLatin1String("stress")},
                 {'t', QLatin1String("tab")},
                 {'s', QLatin1String("size")},
                 {'t', QLatin1String("table")},
                 {'l', QLatin1String("layout")},
                 {'t', QLatin1String("text")},
                 {'a', QLatin1String("align")},
                 {'l', QLatin1String("last")},
                 {'d', QLatin1String("decoration")},
                 {'c', QLatin1String("color")},
                 {'l', QLatin1String("line")},
                 {'s', QLatin1String("skip")},
                 {'s', QLatin1String("style")},
                 {'i', QLatin1String("indent")},
                 {'o', QLatin1String("overflow")},
                 {'s', QLatin1String("shadow")},
                 {'t', QLatin1String("transform")},
                 {'u', QLatin1String("underline")},
                 {'p', QLatin1String("position")},
                 {'t', QLatin1String("top")},
                 {'t', QLatin1String("transform")},
                 {'o', QLatin1String("origin")},
                 {'s', QLatin1String("style")},
                 {'t', QLatin1String("transition")},
                 {'d', QLatin1String("delay")},
                 {'d', QLatin1String("duration")},
                 {'p', QLatin1String("property")},
                 {'t', QLatin1String("timing")},
                 {'f', QLatin1String("function")},
                 {'u', QLatin1String("unicode")},
                 {'b', QLatin1String("bidi")},
                 {'v', QLatin1String("vertical")},
                 {'a', QLatin1String("align")},
                 {'v', QLatin1String("visibility")},
                 {'b', QLatin1String("balance")},
                 {'d', QLatin1String("duration")},
                 {'f', QLatin1String("family")},
                 {'p', QLatin1String("pitch")},
                 {'r', QLatin1String("range")},
                 {'r', QLatin1String("rate")},
                 {'s', QLatin1String("stress")},
                 {'v', QLatin1String("volume")},
                 {'v', QLatin1String("voice")},
                 {'v', QLatin1String("volume")},
                 {'w', QLatin1String("white")},
                 {'s', QLatin1String("space")},
                 {'w', QLatin1String("widows")},
                 {'w', QLatin1String("width")},
                 {'w', QLatin1String("will")},
                 {'c', QLatin1String("change")},
                 {'w', QLatin1String("word")},
                 {'b', QLatin1String("break")},
                 {'s', QLatin1String("spacing")},
                 {'w', QLatin1String("wrap")},
                 {'x', QLatin1String("x")},
                 {'y', QLatin1String("y")},
                 {'z', QLatin1String("z")},
                 {'i', QLatin1String("index")},
                 {'r', QLatin1String("rgb")},
                 {'s', QLatin1String("sans")},
                 {'s', QLatin1String("serif")},
                 {'n', QLatin1String("normal")}};

    css_literals = {};

    css_builtin = {};

    css_other = {};
}